

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_error.h
# Opt level: O3

ostream * jsonnet::internal::operator<<(ostream *o,LocationRange *loc)

{
  size_type sVar1;
  unsigned_long uVar2;
  ostream *poVar3;
  unsigned_long uVar4;
  
  sVar1 = (loc->file)._M_string_length;
  if (sVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(o,(loc->file)._M_dataplus._M_p,sVar1);
  }
  uVar4 = (loc->begin).line;
  if (uVar4 != 0) {
    if ((loc->file)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(o,":",1);
      uVar4 = (loc->begin).line;
    }
    if (uVar4 == (loc->end).line) {
      uVar4 = (loc->begin).column;
      uVar2 = (loc->end).column;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      if (uVar4 != uVar2 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>(o,"-",1);
        std::ostream::_M_insert<unsigned_long>((ulong)o);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(o,"(",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(o,")-(",3);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(o,")",1);
    }
  }
  return o;
}

Assistant:

static inline std::ostream &operator<<(std::ostream &o, const LocationRange &loc)
{
    if (loc.file.length() > 0)
        o << loc.file;
    if (loc.isSet()) {
        if (loc.file.length() > 0)
            o << ":";
        if (loc.begin.line == loc.end.line) {
            if (loc.begin.column == loc.end.column - 1) {
                o << loc.begin;
            } else {
                o << loc.begin << "-" << loc.end.column;
            }
        } else {
            o << "(" << loc.begin << ")-(" << loc.end << ")";
        }
    }
    return o;
}